

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O0

void __thiscall
deqp::gls::ShaderExecUtil::FragmentOutExecutor::execute
          (FragmentOutExecutor *this,int numValues,void **inputs,void **outputs)

{
  pointer *this_00;
  RenderContext *pRVar1;
  glBindFramebufferFunc p_Var2;
  value_type pSVar3;
  glDrawBuffersFunc p_Var4;
  void *dst;
  bool bVar5;
  bool bVar6;
  int iVar7;
  int width;
  deUint32 dVar8;
  deUint32 dVar9;
  GLenum GVar10;
  deBool dVar11;
  DataType DVar12;
  int iVar13;
  int iVar14;
  undefined4 extraout_var;
  size_type sVar15;
  NotSupportedError *this_01;
  reference pvVar16;
  const_reference ppSVar17;
  TestError *this_02;
  reference pvVar18;
  reference vertexArrays_00;
  reference key;
  mapped_type *pmVar19;
  void *src;
  int height;
  float fVar20;
  deUint32 *dstPtr;
  void *local_428;
  deUint32 *srcPtr;
  int valNdx_1;
  PixelBufferAccess local_3f0;
  int local_3c8;
  mapped_type local_3c4;
  int locNdx;
  int outLocation;
  TextureFormat readFormat;
  TextureFormat format_1;
  deUint32 *dstPtrBase;
  int outNumLocs;
  int outVecSize;
  int outSize;
  Symbol *output_1;
  undefined1 local_388 [4];
  int outNdx_1;
  TextureLevel tmpBuf;
  int local_348;
  allocator<unsigned_int> local_341;
  int ndx;
  vector<unsigned_int,_std::allocator<unsigned_int>_> drawBuffers;
  deUint32 format;
  deUint32 renderbuffer;
  Symbol *output;
  undefined1 local_308 [4];
  int outNdx;
  int local_2b8;
  int local_2b4;
  int colNdx;
  int stride;
  int numCols;
  int numRows;
  VertexArrayBinding local_258;
  VertexArrayBinding local_208;
  int local_1b8;
  DataType local_1b4;
  int vecSize;
  DataType basicType;
  void *ptr;
  string attribName;
  Symbol *symbol;
  int inputNdx;
  VertexArrayBinding local_158;
  Vector<float,_2> local_108;
  float local_100;
  float local_fc;
  float fy;
  float fx;
  int iy;
  int ix;
  int valNdx;
  allocator<tcu::Vector<float,_2>_> local_c1;
  undefined1 local_c0 [8];
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> positions;
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> vertexArrays;
  undefined1 local_80 [8];
  RenderbufferVector renderbuffers;
  Framebuffer framebuffer;
  int framebufferH;
  int framebufferW;
  int maxRenderbufferSize;
  bool useIntOutputs;
  Functions *gl;
  void **outputs_local;
  void **inputs_local;
  int numValues_local;
  FragmentOutExecutor *this_local;
  Functions *gl_00;
  
  iVar7 = (*((this->super_ShaderExecutor).m_renderCtx)->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar7);
  bVar5 = hasFloatRenderTargets((this->super_ShaderExecutor).m_renderCtx);
  iVar7 = queryInt(gl_00,0x84e8);
  width = de::min<int>(iVar7,numValues);
  height = (numValues / width + 1) - (uint)(numValues % width == 0);
  glu::TypedObjectWrapper<(glu::ObjectType)3>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)3> *)
             &renderbuffers.super_ObjectVector.m_objects.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(this->super_ShaderExecutor).m_renderCtx);
  pRVar1 = (this->super_ShaderExecutor).m_renderCtx;
  sVar15 = std::
           vector<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::allocator<const_deqp::gls::ShaderExecUtil::Symbol_*>_>
           ::size(&(this->m_outputLayout).locationSymbols);
  glu::TypedObjectVector<(glu::ObjectType)2>::TypedObjectVector
            ((TypedObjectVector<(glu::ObjectType)2> *)local_80,pRVar1,sVar15);
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::vector
            ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)
             &positions.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::allocator<tcu::Vector<float,_2>_>::allocator(&local_c1);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)local_c0,
             (long)numValues,&local_c1);
  std::allocator<tcu::Vector<float,_2>_>::~allocator(&local_c1);
  if (iVar7 < height) {
    ix._2_1_ = 1;
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&valNdx,"Value count is too high for maximum supported renderbuffer size",
               (allocator<char> *)((long)&ix + 3));
    tcu::NotSupportedError::NotSupportedError(this_01,(string *)&valNdx);
    ix._2_1_ = 0;
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  for (iy = 0; iy < numValues; iy = iy + 1) {
    fx = (float)(iy % width);
    fy = (float)(iy / width);
    fVar20 = ((float)(int)fx + 0.5) / (float)width;
    local_fc = fVar20 + fVar20 + -1.0;
    fVar20 = ((float)(int)fy + 0.5) / (float)height;
    local_100 = fVar20 + fVar20 + -1.0;
    tcu::Vector<float,_2>::Vector(&local_108,local_fc,local_100);
    pvVar16 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::
              operator[]((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                         local_c0,(long)iy);
    *&pvVar16->m_data = local_108.m_data;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&inputNdx,"a_position",(allocator<char> *)((long)&symbol + 7));
  pvVar16 = std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::operator[]
                      ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                       local_c0,0);
  glu::va::Float(&local_158,(string *)&inputNdx,2,numValues,0,pvVar16->m_data);
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::push_back
            ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)
             &positions.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&local_158);
  glu::VertexArrayBinding::~VertexArrayBinding(&local_158);
  std::__cxx11::string::~string((string *)&inputNdx);
  std::allocator<char>::~allocator((allocator<char> *)((long)&symbol + 7));
  for (symbol._0_4_ = 0; iVar7 = (int)symbol,
      sVar15 = std::
               vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
               ::size(&(this->super_ShaderExecutor).m_inputs), iVar7 < (int)sVar15;
      symbol._0_4_ = (int)symbol + 1) {
    attribName.field_2._8_8_ =
         std::
         vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
         ::operator[](&(this->super_ShaderExecutor).m_inputs,(long)(int)symbol);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ptr,"a_",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   attribName.field_2._8_8_);
    _vecSize = (float *)inputs[(int)symbol];
    local_1b4 = glu::VarType::getBasicType((VarType *)(attribName.field_2._8_8_ + 0x20));
    local_1b8 = glu::getDataTypeScalarSize(local_1b4);
    bVar6 = glu::isDataTypeFloatOrVec(local_1b4);
    if (bVar6) {
      glu::va::Float(&local_208,(string *)&ptr,local_1b8,numValues,0,_vecSize);
      std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::push_back
                ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)
                 &positions.
                  super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_208);
      glu::VertexArrayBinding::~VertexArrayBinding(&local_208);
    }
    else {
      bVar6 = glu::isDataTypeIntOrIVec(local_1b4);
      if (bVar6) {
        glu::va::Int32(&local_258,(string *)&ptr,local_1b8,numValues,0,(deInt32 *)_vecSize);
        std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::push_back
                  ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)
                   &positions.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_258);
        glu::VertexArrayBinding::~VertexArrayBinding(&local_258);
      }
      else {
        bVar6 = glu::isDataTypeUintOrUVec(local_1b4);
        if (bVar6) {
          glu::va::Uint32((VertexArrayBinding *)&numCols,(string *)&ptr,local_1b8,numValues,0,
                          (deUint32 *)_vecSize);
          std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::push_back
                    ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)
                     &positions.
                      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)&numCols);
          glu::VertexArrayBinding::~VertexArrayBinding((VertexArrayBinding *)&numCols);
        }
        else {
          bVar6 = glu::isDataTypeMatrix(local_1b4);
          if (bVar6) {
            stride = glu::getDataTypeMatrixNumRows(local_1b4);
            colNdx = glu::getDataTypeMatrixNumColumns(local_1b4);
            local_2b4 = stride * colNdx * 4;
            for (local_2b8 = 0; local_2b8 < colNdx; local_2b8 = local_2b8 + 1) {
              glu::va::Float((VertexArrayBinding *)local_308,(string *)&ptr,local_2b8,stride,
                             numValues,local_2b4,_vecSize + local_2b8 * stride);
              std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
              push_back((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *
                        )&positions.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_308
                       );
              glu::VertexArrayBinding::~VertexArrayBinding((VertexArrayBinding *)local_308);
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&ptr);
  }
  p_Var2 = gl_00->bindFramebuffer;
  dVar8 = glu::ObjectWrapper::operator*
                    ((ObjectWrapper *)
                     &renderbuffers.super_ObjectVector.m_objects.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  (*p_Var2)(0x8d40,dVar8);
  for (output._4_4_ = 0;
      sVar15 = std::
               vector<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::allocator<const_deqp::gls::ShaderExecUtil::Symbol_*>_>
               ::size(&(this->m_outputLayout).locationSymbols), output._4_4_ < (int)sVar15;
      output._4_4_ = output._4_4_ + 1) {
    ppSVar17 = std::
               vector<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::allocator<const_deqp::gls::ShaderExecUtil::Symbol_*>_>
               ::operator[](&(this->m_outputLayout).locationSymbols,(long)output._4_4_);
    pSVar3 = *ppSVar17;
    dVar8 = glu::ObjectVector::operator[]((ObjectVector *)local_80,(long)output._4_4_);
    drawBuffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)getRenderbufferFormatForOutput(&pSVar3->varType,!bVar5);
    dVar9 = glu::getInternalFormat
                      ((TextureFormat)
                       drawBuffers.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
    (*gl_00->bindRenderbuffer)(0x8d41,dVar8);
    (*gl_00->renderbufferStorage)(0x8d41,dVar9,width,height);
    (*gl_00->framebufferRenderbuffer)(0x8d40,output._4_4_ + 0x8ce0,0x8d41,dVar8);
  }
  (*gl_00->bindRenderbuffer)(0x8d41,0);
  GVar10 = (*gl_00->getError)();
  glu::checkError(GVar10,"Failed to set up framebuffer object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderExecUtil.cpp"
                  ,0x27e);
  while ((dVar11 = ::deGetFalse(), dVar11 == 0 &&
         (GVar10 = (*gl_00->checkFramebufferStatus)(0x8d40), GVar10 == 0x8cd5))) {
    dVar11 = ::deGetFalse();
    if (dVar11 == 0) {
      sVar15 = std::
               vector<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::allocator<const_deqp::gls::ShaderExecUtil::Symbol_*>_>
               ::size(&(this->m_outputLayout).locationSymbols);
      std::allocator<unsigned_int>::allocator(&local_341);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&ndx,sVar15,&local_341);
      std::allocator<unsigned_int>::~allocator(&local_341);
      for (local_348 = 0;
          sVar15 = std::
                   vector<const_deqp::gls::ShaderExecUtil::Symbol_*,_std::allocator<const_deqp::gls::ShaderExecUtil::Symbol_*>_>
                   ::size(&(this->m_outputLayout).locationSymbols), local_348 < (int)sVar15;
          local_348 = local_348 + 1) {
        pvVar18 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&ndx,
                             (long)local_348);
        *pvVar18 = local_348 + 0x8ce0;
      }
      p_Var4 = gl_00->drawBuffers;
      sVar15 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&ndx);
      pvVar18 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&ndx,0);
      (*p_Var4)((GLsizei)sVar15,pvVar18);
      GVar10 = (*gl_00->getError)();
      glu::checkError(GVar10,"glDrawBuffers()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderExecUtil.cpp"
                      ,0x286);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&ndx);
      (*gl_00->viewport)(0,0,width,height);
      pRVar1 = (this->super_ShaderExecutor).m_renderCtx;
      dVar8 = (*(this->super_ShaderExecutor)._vptr_ShaderExecutor[4])();
      this_00 = &positions.
                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage;
      sVar15 = std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::size
                         ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>
                           *)this_00);
      vertexArrays_00 =
           std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
           operator[]((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)
                      this_00,0);
      glu::pr::Points((PrimitiveList *)&tmpBuf.m_data.m_cap,numValues);
      glu::draw(pRVar1,dVar8,(int)sVar15,vertexArrays_00,(PrimitiveList *)&tmpBuf.m_data.m_cap,
                (DrawUtilCallback *)0x0);
      GVar10 = (*gl_00->getError)();
      glu::checkError(GVar10,"Error in draw",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderExecUtil.cpp"
                      ,0x28d);
      tcu::TextureLevel::TextureLevel((TextureLevel *)local_388);
      for (output_1._4_4_ = 0;
          sVar15 = std::
                   vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                   ::size(&(this->super_ShaderExecutor).m_outputs), output_1._4_4_ < (int)sVar15;
          output_1._4_4_ = output_1._4_4_ + 1) {
        key = std::
              vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
              ::operator[](&(this->super_ShaderExecutor).m_outputs,(long)output_1._4_4_);
        iVar7 = glu::VarType::getScalarSize(&key->varType);
        DVar12 = glu::VarType::getBasicType(&key->varType);
        iVar13 = glu::getDataTypeNumComponents(DVar12);
        DVar12 = glu::VarType::getBasicType(&key->varType);
        iVar14 = glu::getDataTypeNumLocations(DVar12);
        dst = outputs[output_1._4_4_];
        readFormat = getRenderbufferFormatForOutput(&key->varType,!bVar5);
        tcu::TextureFormat::TextureFormat((TextureFormat *)&locNdx,RGBA,readFormat.type);
        pmVar19 = de::
                  lookup<std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>>
                            (&(this->m_outputLayout).locationMap,&key->name);
        local_3c4 = *pmVar19;
        tcu::TextureLevel::setStorage
                  ((TextureLevel *)local_388,(TextureFormat *)&locNdx,width,height,1);
        for (local_3c8 = 0; local_3c8 < iVar14; local_3c8 = local_3c8 + 1) {
          (*gl_00->readBuffer)(local_3c4 + 0x8ce0 + local_3c8);
          pRVar1 = (this->super_ShaderExecutor).m_renderCtx;
          tcu::TextureLevel::getAccess(&local_3f0,(TextureLevel *)local_388);
          glu::readPixels(pRVar1,0,0,&local_3f0);
          GVar10 = (*gl_00->getError)();
          glu::checkError(GVar10,"Reading pixels",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderExecUtil.cpp"
                          ,0x2a6);
          if ((iVar7 == 4) && (iVar14 == 1)) {
            tcu::TextureLevel::getAccess
                      ((PixelBufferAccess *)&stack0xfffffffffffffbe8,(TextureLevel *)local_388);
            src = tcu::PixelBufferAccess::getDataPtr((PixelBufferAccess *)&stack0xfffffffffffffbe8);
            ::deMemcpy(dst,src,(long)(numValues * iVar13) << 2);
          }
          else {
            for (srcPtr._4_4_ = 0; srcPtr._4_4_ < numValues; srcPtr._4_4_ = srcPtr._4_4_ + 1) {
              tcu::TextureLevel::getAccess((PixelBufferAccess *)&dstPtr,(TextureLevel *)local_388);
              local_428 = tcu::PixelBufferAccess::getDataPtr((PixelBufferAccess *)&dstPtr);
              local_428 = (void *)((long)local_428 + (long)(srcPtr._4_4_ << 2) * 4);
              ::deMemcpy((void *)((long)dst + (long)(iVar7 * srcPtr._4_4_ + iVar13 * local_3c8) * 4)
                         ,local_428,(long)iVar13 << 2);
            }
          }
        }
      }
      tcu::TextureLevel::~TextureLevel((TextureLevel *)local_388);
      (*gl_00->bindFramebuffer)(0x8d40,0);
      std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~vector
                ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)local_c0)
      ;
      std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::~vector
                ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)
                 &positions.
                  super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      glu::TypedObjectVector<(glu::ObjectType)2>::~TypedObjectVector
                ((TypedObjectVector<(glu::ObjectType)2> *)local_80);
      glu::TypedObjectWrapper<(glu::ObjectType)3>::~TypedObjectWrapper
                ((TypedObjectWrapper<(glu::ObjectType)3> *)
                 &renderbuffers.super_ObjectVector.m_objects.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      return;
    }
  }
  this_02 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_02,(char *)0x0,
             "gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderExecUtil.cpp"
             ,0x27f);
  __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void FragmentOutExecutor::execute (int numValues, const void* const* inputs, void* const* outputs)
{
	const glw::Functions&			gl					= m_renderCtx.getFunctions();
	const bool						useIntOutputs		= !hasFloatRenderTargets(m_renderCtx);
	const int						maxRenderbufferSize	= queryInt(gl, GL_MAX_RENDERBUFFER_SIZE);
	const int						framebufferW		= de::min(maxRenderbufferSize, numValues);
	const int						framebufferH		= (numValues / framebufferW) + ((numValues % framebufferW != 0) ? 1 : 0);

	glu::Framebuffer				framebuffer			(m_renderCtx);
	glu::RenderbufferVector			renderbuffers		(m_renderCtx, m_outputLayout.locationSymbols.size());

	vector<glu::VertexArrayBinding>	vertexArrays;
	vector<tcu::Vec2>				positions			(numValues);

	if (framebufferH > maxRenderbufferSize)
		throw tcu::NotSupportedError("Value count is too high for maximum supported renderbuffer size");

	// Compute positions - 1px points are used to drive fragment shading.
	for (int valNdx = 0; valNdx < numValues; valNdx++)
	{
		const int		ix		= valNdx % framebufferW;
		const int		iy		= valNdx / framebufferW;
		const float		fx		= -1.0f + 2.0f*((float(ix) + 0.5f) / float(framebufferW));
		const float		fy		= -1.0f + 2.0f*((float(iy) + 0.5f) / float(framebufferH));

		positions[valNdx] = tcu::Vec2(fx, fy);
	}

	// Vertex inputs.
	vertexArrays.push_back(glu::va::Float("a_position", 2, numValues, 0, (const float*)&positions[0]));

	for (int inputNdx = 0; inputNdx < (int)m_inputs.size(); inputNdx++)
	{
		const Symbol&		symbol		= m_inputs[inputNdx];
		const std::string	attribName	= "a_" + symbol.name;
		const void*			ptr			= inputs[inputNdx];
		const glu::DataType	basicType	= symbol.varType.getBasicType();
		const int			vecSize		= glu::getDataTypeScalarSize(basicType);

		if (glu::isDataTypeFloatOrVec(basicType))
			vertexArrays.push_back(glu::va::Float(attribName, vecSize, numValues, 0, (const float*)ptr));
		else if (glu::isDataTypeIntOrIVec(basicType))
			vertexArrays.push_back(glu::va::Int32(attribName, vecSize, numValues, 0, (const deInt32*)ptr));
		else if (glu::isDataTypeUintOrUVec(basicType))
			vertexArrays.push_back(glu::va::Uint32(attribName, vecSize, numValues, 0, (const deUint32*)ptr));
		else if (glu::isDataTypeMatrix(basicType))
		{
			int		numRows	= glu::getDataTypeMatrixNumRows(basicType);
			int		numCols	= glu::getDataTypeMatrixNumColumns(basicType);
			int		stride	= numRows * numCols * (int)sizeof(float);

			for (int colNdx = 0; colNdx < numCols; ++colNdx)
				vertexArrays.push_back(glu::va::Float(attribName, colNdx, numRows, numValues, stride, ((const float*)ptr) + colNdx * numRows));
		}
		else
			DE_ASSERT(false);
	}

	// Construct framebuffer.
	gl.bindFramebuffer(GL_FRAMEBUFFER, *framebuffer);

	for (int outNdx = 0; outNdx < (int)m_outputLayout.locationSymbols.size(); ++outNdx)
	{
		const Symbol&	output			= *m_outputLayout.locationSymbols[outNdx];
		const deUint32	renderbuffer	= renderbuffers[outNdx];
		const deUint32	format			= glu::getInternalFormat(getRenderbufferFormatForOutput(output.varType, useIntOutputs));

		gl.bindRenderbuffer(GL_RENDERBUFFER, renderbuffer);
		gl.renderbufferStorage(GL_RENDERBUFFER, format, framebufferW, framebufferH);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0+outNdx, GL_RENDERBUFFER, renderbuffer);
	}
	gl.bindRenderbuffer(GL_RENDERBUFFER, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to set up framebuffer object");
	TCU_CHECK(gl.checkFramebufferStatus(GL_FRAMEBUFFER) == GL_FRAMEBUFFER_COMPLETE);

	{
		vector<deUint32> drawBuffers(m_outputLayout.locationSymbols.size());
		for (int ndx = 0; ndx < (int)m_outputLayout.locationSymbols.size(); ndx++)
			drawBuffers[ndx] = GL_COLOR_ATTACHMENT0+ndx;
		gl.drawBuffers((int)drawBuffers.size(), &drawBuffers[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawBuffers()");
	}

	// Render
	gl.viewport(0, 0, framebufferW, framebufferH);
	glu::draw(m_renderCtx, this->getProgram(), (int)vertexArrays.size(), &vertexArrays[0],
			  glu::pr::Points(numValues));
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error in draw");

	// Read back pixels.
	{
		tcu::TextureLevel	tmpBuf;

		// \todo [2013-08-07 pyry] Some fast-paths could be added here.

		for (int outNdx = 0; outNdx < (int)m_outputs.size(); ++outNdx)
		{
			const Symbol&				output			= m_outputs[outNdx];
			const int					outSize			= output.varType.getScalarSize();
			const int					outVecSize		= glu::getDataTypeNumComponents(output.varType.getBasicType());
			const int					outNumLocs		= glu::getDataTypeNumLocations(output.varType.getBasicType());
			deUint32*					dstPtrBase		= static_cast<deUint32*>(outputs[outNdx]);
			const tcu::TextureFormat	format			= getRenderbufferFormatForOutput(output.varType, useIntOutputs);
			const tcu::TextureFormat	readFormat		(tcu::TextureFormat::RGBA, format.type);
			const int					outLocation		= de::lookup(m_outputLayout.locationMap, output.name);

			tmpBuf.setStorage(readFormat, framebufferW, framebufferH);

			for (int locNdx = 0; locNdx < outNumLocs; ++locNdx)
			{
				gl.readBuffer(GL_COLOR_ATTACHMENT0 + outLocation + locNdx);
				glu::readPixels(m_renderCtx, 0, 0, tmpBuf.getAccess());
				GLU_EXPECT_NO_ERROR(gl.getError(), "Reading pixels");

				if (outSize == 4 && outNumLocs == 1)
					deMemcpy(dstPtrBase, tmpBuf.getAccess().getDataPtr(), numValues*outVecSize*sizeof(deUint32));
				else
				{
					for (int valNdx = 0; valNdx < numValues; valNdx++)
					{
						const deUint32* srcPtr = (const deUint32*)tmpBuf.getAccess().getDataPtr() + valNdx*4;
						deUint32*		dstPtr = &dstPtrBase[outSize*valNdx + outVecSize*locNdx];
						deMemcpy(dstPtr, srcPtr, outVecSize*sizeof(deUint32));
					}
				}
			}
		}
	}

	// \todo [2013-08-07 pyry] Clear draw buffers & viewport?
	gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
}